

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::DeformableConv2D_x86_avx512::create_pipeline(DeformableConv2D_x86_avx512 *this,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  int *piVar4;
  void *pvVar5;
  long *plVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Mat *pMVar10;
  uint _h;
  Layer *pLVar11;
  ulong uVar12;
  undefined4 *puVar13;
  _func_int ***ppp_Var14;
  _func_int ***ppp_Var15;
  long lVar16;
  undefined4 *puVar17;
  ulong uVar18;
  Allocator *pAVar19;
  _func_int ***ppp_Var20;
  long lVar21;
  int iVar22;
  int iVar23;
  int k;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  _func_int ***ppp_Var27;
  undefined1 auVar28 [16];
  ParamDict pd_5;
  ParamDict pd;
  undefined1 auStack_198 [12];
  uint local_18c;
  Option *local_188;
  uint local_17c;
  Allocator *local_178;
  ParamDict local_170;
  ulong local_160;
  Mat local_158;
  void *local_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  long *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined8 local_d0;
  DeformableConv2D_x86_avx512 *local_c8;
  undefined4 *local_c0;
  ModelBinFromMatArray local_b8;
  Mat local_a8;
  ulong local_58;
  undefined4 *local_50;
  Mat *local_48;
  long local_40;
  long local_38;
  
  p_Var2 = this->_vptr_DeformableConv2D_x86_avx512[-3];
  local_188 = opt;
  switch(*(undefined4 *)(&this->field_0x104 + (long)p_Var2)) {
  case 1:
    pLVar11 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_158);
    (*pLVar11->_vptr_Layer[2])(pLVar11,&local_158);
    break;
  case 2:
    pLVar11 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_158);
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var2));
    (*pLVar11->_vptr_Layer[2])(pLVar11,&local_158);
    goto LAB_005670b9;
  case 3:
    pLVar11 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_158);
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var2));
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)(*(long *)(&this->field_0x108 + (long)p_Var2) + 4));
    (*pLVar11->_vptr_Layer[2])(pLVar11,&local_158);
    goto LAB_005670b9;
  case 4:
    pLVar11 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_158);
    (*pLVar11->_vptr_Layer[2])(pLVar11,&local_158);
    break;
  case 5:
    pLVar11 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_158);
    (*pLVar11->_vptr_Layer[2])(pLVar11,&local_158);
    break;
  case 6:
    pLVar11 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_158);
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var2));
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)(*(long *)(&this->field_0x108 + (long)p_Var2) + 4));
    (*pLVar11->_vptr_Layer[2])(pLVar11,&local_158);
LAB_005670b9:
    ParamDict::~ParamDict((ParamDict *)&local_158);
    opt = local_188;
    goto LAB_005670cd;
  default:
    pLVar11 = (Layer *)0x0;
    goto LAB_005670cd;
  }
  opt = local_188;
  ParamDict::~ParamDict((ParamDict *)&local_158);
LAB_005670cd:
  if (pLVar11 != (Layer *)0x0) {
    (*pLVar11->_vptr_Layer[4])(pLVar11,opt);
  }
  this->activation = pLVar11;
  p_Var2 = this->_vptr_DeformableConv2D_x86_avx512[-3];
  iVar23 = *(int *)(&this->field_0xd4 + (long)p_Var2);
  lVar24 = (long)iVar23;
  local_178 = (Allocator *)(long)*(int *)(&this->field_0xd8 + (long)p_Var2);
  local_18c = *(int *)(&this->field_0xd8 + (long)p_Var2) * iVar23;
  uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var2);
  uVar12 = (long)*(int *)(&this->field_0x100 + (long)p_Var2) / (long)(int)local_18c;
  uVar12 = (ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff;
  uVar18 = (long)uVar12 / (long)(int)uVar1;
  _h = (uint)uVar18;
  uVar25 = uVar18 & 0xffffffff;
  iVar22 = 1;
  uVar26 = 1;
  if (opt->use_packing_layout == true) {
    iVar22 = 0x10;
    uVar26 = 0x10;
    if ((uVar18 & 0xf) != 0) {
      if ((uVar18 & 7) == 0) {
        uVar26 = 8;
      }
      else {
        uVar26 = (uint)((uVar18 & 3) == 0) * 3 + 1;
      }
    }
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 7) == 0) {
        iVar22 = 8;
      }
      else {
        iVar22 = (uint)((uVar1 & 3) == 0) * 3 + 1;
      }
    }
  }
  local_17c = _h;
  local_c8 = this;
  if (opt->use_sgemm_convolution == true) {
    pLVar11 = create_layer(0x4a);
    this->gemm = pLVar11;
    ParamDict::ParamDict(&local_170);
    ParamDict::set(&local_170,2,0);
    ParamDict::set(&local_170,3,0);
    ParamDict::set(&local_170,4,1);
    ParamDict::set(&local_170,5,0);
    ParamDict::set(&local_170,6,1);
    ParamDict::set(&local_170,7,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx512[-3]));
    ParamDict::set(&local_170,8,0);
    iVar23 = _h * local_18c;
    ParamDict::set(&local_170,9,iVar23);
    ParamDict::set(&local_170,10,
                   -(uint)(*(int *)(&this->field_0xfc +
                                   (long)this->_vptr_DeformableConv2D_x86_avx512[-3]) == 0) | 1);
    ParamDict::set(&local_170,0xb,1);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_170);
    local_a8.cstep = 0;
    local_a8.data = (Allocator *)0x0;
    local_a8.refcount._0_4_ = 0;
    local_a8.refcount._4_4_ = 0;
    local_a8.elemsize._0_4_ = 0;
    local_a8.elempack = 0;
    local_a8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
    local_a8.elemsize._4_4_ = (int)local_a8.refcount;
    local_a8.allocator = (Allocator *)local_a8.data;
    local_a8.dims = (int)local_a8.refcount;
    local_a8.w = local_a8.refcount._4_4_;
    local_a8.c = local_a8.elempack;
    Mat::reshape(&local_158,
                 (Mat *)(&this->field_0x150 + (long)this->_vptr_DeformableConv2D_x86_avx512[-3]),
                 local_18c,_h,
                 (int)((Mat *)(&this->field_0x150 +
                              (long)this->_vptr_DeformableConv2D_x86_avx512[-3]))[-2].elemsize,
                 (Allocator *)0x0);
    Mat::create(&local_a8,iVar23,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx512[-3]),4,
                (Allocator *)0x0);
    opt = local_188;
    pp_Var3 = this->_vptr_DeformableConv2D_x86_avx512;
    if (0 < *(int *)(&this->field_0xd0 + (long)pp_Var3[-3])) {
      local_178 = (Allocator *)local_a8.data;
      local_160 = (long)local_a8.w * CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize)
      ;
      uVar12 = (ulong)uVar26;
      lVar24 = 0;
      do {
        if ((int)uVar26 <= (int)uVar25) {
          lVar21 = (long)local_158.w *
                   CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
          ppp_Var14 = (_func_int ***)
                      ((long)(_func_int ***)local_158.data +
                      CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize) *
                      local_158.cstep * lVar24);
          ppp_Var20 = (_func_int ***)((long)(_func_int ***)local_a8.data + local_160 * lVar24);
          lVar16 = 0;
          do {
            if (0 < (int)local_18c) {
              uVar25 = 0;
              uVar18 = uVar12;
              ppp_Var27 = ppp_Var14;
              ppp_Var15 = ppp_Var14;
              do {
                do {
                  *(undefined4 *)ppp_Var20 = *(undefined4 *)ppp_Var27;
                  ppp_Var20 = (_func_int ***)((long)ppp_Var20 + 4);
                  uVar18 = uVar18 - 1;
                  ppp_Var27 = (_func_int ***)((long)ppp_Var27 + lVar21);
                } while (uVar18 != 0);
                uVar25 = uVar25 + 1;
                ppp_Var27 = (_func_int ***)((long)ppp_Var15 + 4);
                uVar18 = uVar12;
                ppp_Var15 = ppp_Var27;
              } while (uVar25 != local_18c);
            }
            lVar16 = lVar16 + uVar12;
            ppp_Var14 = (_func_int ***)((long)ppp_Var14 + lVar21 * uVar12);
          } while (lVar16 < (long)((long)(int)_h - (ulong)(uVar26 - 1)));
        }
        lVar24 = lVar24 + 1;
        uVar25 = (ulong)local_17c;
        this = local_c8;
      } while (lVar24 < *(int *)(&local_c8->field_0xd0 + (long)pp_Var3[-3]));
    }
    piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_158.data != (Allocator *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (*(int *)(&this->field_0xfc + (long)this->_vptr_DeformableConv2D_x86_avx512[-3]) == 0) {
      piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,(int)local_a8.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      local_158.data = local_a8.data;
      local_158.refcount._0_4_ = (int)local_a8.refcount;
      local_158.refcount._4_4_ = local_a8.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_a8.elemsize;
      local_158.elemsize._4_4_ = local_a8.elemsize._4_4_;
      local_158.elempack = local_a8.elempack;
      local_158.allocator = local_a8.allocator;
      local_158.dims = local_a8.dims;
      local_158.w = local_a8.w;
      local_158.h = local_a8.h;
      local_158.d = local_a8.d;
      local_158.c = local_a8.c;
      local_158.cstep = local_a8.cstep;
      pLVar11 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_b8,&local_158);
      (*pLVar11->_vptr_Layer[3])(pLVar11,&local_b8);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_b8);
      piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_158.data != (Allocator *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      lVar24 = 0x40;
      auVar28._0_12_ = ZEXT812(0);
      auVar28._12_4_ = 0;
      do {
        *(undefined8 *)((long)&local_158.data + lVar24) = 0;
        *(undefined1 (*) [16])(auStack_198 + lVar24) = auVar28;
        *(undefined1 (*) [16])((long)&local_18c + lVar24) = auVar28;
        *(undefined1 (*) [16])((long)&local_178 + lVar24) = auVar28;
        *(undefined1 (*) [16])((long)&local_170._vptr_ParamDict + lVar24 + 4) = auVar28;
        lVar24 = lVar24 + 0x48;
      } while (lVar24 != 0xd0);
      piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,(int)local_a8.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_158.data != (Allocator *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_158.data = local_a8.data;
      local_158.refcount._0_4_ = (int)local_a8.refcount;
      local_158.refcount._4_4_ = local_a8.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_a8.elemsize;
      local_158.elemsize._4_4_ = local_a8.elemsize._4_4_;
      local_158.elempack = local_a8.elempack;
      local_158.allocator = local_a8.allocator;
      local_158.dims = local_a8.dims;
      local_158.w = local_a8.w;
      local_158.h = local_a8.h;
      local_158.d = local_a8.d;
      local_158.c = local_a8.c;
      local_158.cstep = local_a8.cstep;
      p_Var2 = this->_vptr_DeformableConv2D_x86_avx512[-3];
      if (&local_110 != (void **)(&this->field_0x198 + (long)p_Var2)) {
        piVar4 = *(int **)(&this->field_0x1a0 + (long)p_Var2);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(uStack_104,uStack_108);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_f0 == (long *)0x0) {
              if (local_110 != (void *)0x0) {
                free(local_110);
              }
            }
            else {
              (**(code **)(*local_f0 + 0x18))();
            }
          }
        }
        local_110 = *(void **)(&this->field_0x198 + (long)p_Var2);
        uStack_108 = (undefined4)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var2);
        uStack_104 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var2) >> 0x20)
        ;
        uStack_100 = (undefined4)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var2);
        uStack_fc = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var2) >> 0x20);
        uStack_f8 = *(undefined4 *)(&this->field_0x1b0 + (long)p_Var2);
        local_f0 = *(long **)(&this->field_0x1b8 + (long)p_Var2);
        local_e8 = *(undefined8 *)(&this->field_0x1c0 + (long)p_Var2);
        uStack_e0 = *(undefined8 *)(&this->field_0x1c8 + (long)p_Var2);
        local_d8 = *(undefined4 *)(&this->field_0x1d0 + (long)p_Var2);
        local_d0 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var2);
      }
      pLVar11 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_b8,&local_158);
      (*pLVar11->_vptr_Layer[3])(pLVar11,&local_b8);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_b8);
      lVar24 = 0x48;
      do {
        piVar4 = *(int **)((long)&local_158.refcount + lVar24);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = *(void **)((long)&local_158.data + lVar24);
            plVar6 = *(long **)((long)&local_158.allocator + lVar24);
            if (plVar6 == (long *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (**(code **)(*plVar6 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_158.cstep + lVar24) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar24 + 4) = 0;
        *(undefined8 *)((long)&local_158.elemsize + lVar24 + 4) = 0;
        *(undefined8 *)((long)&local_158.data + lVar24) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar24) = 0;
        *(undefined8 *)((long)&local_158.dims + lVar24) = 0;
        *(undefined8 *)((long)&local_158.h + lVar24) = 0;
        *(undefined4 *)((long)&local_158.c + lVar24) = 0;
        lVar24 = lVar24 + -0x48;
        opt = local_188;
      } while (lVar24 != -0x48);
    }
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,(int)local_a8.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_a8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_a8.data != (Allocator *)0x0) {
            free(local_a8.data);
          }
        }
        else {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_a8.cstep = 0;
    local_a8.data = (void *)0x0;
    local_a8.refcount._0_4_ = 0;
    local_a8.refcount._4_4_ = 0;
    local_a8.elemsize._0_4_ = 0;
    local_a8.elemsize._4_4_ = 0;
    local_a8.elempack = 0;
    local_a8.dims = 0;
    local_a8.w = 0;
    local_a8.h = 0;
    local_a8.d = 0;
    local_a8.c = 0;
    ParamDict::~ParamDict(&local_170);
  }
  else if ((iVar22 == 1) && (uVar26 == 1)) {
    if (p_Var2 != (_func_int *)0xfffffffffffffec0) {
      piVar4 = *(int **)(&this->field_0x158 + (long)p_Var2);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (this->weight_data_tm).refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = (this->weight_data_tm).data;
          pAVar19 = (this->weight_data_tm).allocator;
          if (pAVar19 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar19->_vptr_Allocator[3])
                      (pAVar19,pvVar5,(long)uVar12 % (long)(int)uVar1 & 0xffffffff);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      piVar4 = *(int **)((long)(&this->field_0x150 + (long)p_Var2) + 8);
      (this->weight_data_tm).data = *(void **)(&this->field_0x150 + (long)p_Var2);
      (this->weight_data_tm).refcount = piVar4;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x160 + (long)p_Var2);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x168 + (long)p_Var2);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x170 + (long)p_Var2);
      uVar8 = *(undefined8 *)(&this->field_0x178 + (long)p_Var2);
      uVar9 = *(undefined8 *)((long)(&this->field_0x178 + (long)p_Var2) + 8);
      (this->weight_data_tm).dims = (int)uVar8;
      (this->weight_data_tm).w = (int)((ulong)uVar8 >> 0x20);
      (this->weight_data_tm).h = (int)uVar9;
      (this->weight_data_tm).d = (int)((ulong)uVar9 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x188 + (long)p_Var2);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x190 + (long)p_Var2);
      opt = local_188;
    }
  }
  else {
    local_48 = &this->weight_data_tm;
    local_50 = *(undefined4 **)(&this->field_0x150 + (long)p_Var2);
    local_58 = (ulong)uVar1;
    Mat::create(local_48,(int)(_h * local_18c * uVar1) / (int)(uVar26 * iVar22),
                (ulong)(uint)(iVar22 * 4) * (ulong)uVar26,uVar26 * iVar22,(Allocator *)0x0);
    pMVar10 = local_48;
    if (0 < (int)local_58) {
      pvVar5 = (local_c8->weight_data_tm).data;
      lVar16 = (long)(int)_h * (long)local_178 * lVar24;
      local_40 = lVar16 * 4;
      local_38 = lVar24 * 4;
      local_160 = 0;
      do {
        if (0 < (int)local_178) {
          local_c0 = local_50;
          pAVar19 = (Allocator *)0x0;
          do {
            if (0 < iVar23) {
              lVar21 = 0;
              puVar13 = local_c0;
              do {
                if (0 < (int)uVar25) {
                  uVar12 = (ulong)(uint)((int)local_160 >> 0x1f) << 0x20 | local_160 & 0xffffffff;
                  uVar25 = 0;
                  puVar17 = puVar13;
                  do {
                    uVar7 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff;
                    *(undefined4 *)
                     ((long)pvVar5 +
                     (long)(int)((((int)((long)uVar7 / (long)(int)uVar26) +
                                  ((int)lVar21 +
                                  ((int)((long)uVar12 / (long)iVar22) * (int)local_178 +
                                  (int)pAVar19) * iVar23) * ((int)local_17c / (int)uVar26)) * uVar26
                                 + (int)((long)uVar7 % (long)(int)uVar26)) * iVar22 +
                                (int)((long)uVar12 % (long)iVar22)) * 4) = *puVar17;
                    uVar25 = uVar25 + 1;
                    puVar17 = puVar17 + (long)local_178 * lVar24;
                  } while ((uVar18 & 0xffffffff) != uVar25);
                }
                lVar21 = lVar21 + 1;
                puVar13 = puVar13 + 1;
                uVar25 = (ulong)local_17c;
              } while (lVar21 != lVar24);
            }
            pAVar19 = (Allocator *)((long)&pAVar19->_vptr_Allocator + 1);
            local_c0 = local_c0 + lVar24;
          } while (pAVar19 != local_178);
        }
        _h = (uint)uVar25;
        local_160 = local_160 + 1;
        local_50 = local_50 + lVar16;
      } while (local_160 != local_58);
    }
    Mat::reshape(&local_158,local_48,(int)_h / (int)uVar26,local_18c,
                 (int)((long)((ulong)(uint)((int)local_58 >> 0x1f) << 0x20 | local_58 & 0xffffffff)
                      / (long)iVar22),(Allocator *)0x0);
    this = local_c8;
    opt = local_188;
    if (&local_158 != pMVar10) {
      piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (local_c8->weight_data_tm).refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = (local_c8->weight_data_tm).data;
          pAVar19 = (local_c8->weight_data_tm).allocator;
          if (pAVar19 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar19->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&pMVar10->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar10->elemsize + 4) = 0;
      pMVar10->data = (void *)0x0;
      pMVar10->refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      (this->weight_data_tm).data = local_158.data;
      (this->weight_data_tm).refcount =
           (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      (this->weight_data_tm).elemsize =
           CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
      (this->weight_data_tm).elempack = local_158.elempack;
      (this->weight_data_tm).allocator = local_158.allocator;
      (this->weight_data_tm).dims = local_158.dims;
      (this->weight_data_tm).w = local_158.w;
      (this->weight_data_tm).h = local_158.h;
      (this->weight_data_tm).d = local_158.d;
      (this->weight_data_tm).c = local_158.c;
      (this->weight_data_tm).cstep = local_158.cstep;
    }
    piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_158.data != (Allocator *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (opt->lightmode == true) {
    p_Var2 = this->_vptr_DeformableConv2D_x86_avx512[-3];
    piVar4 = *(int **)(&this->field_0x158 + (long)p_Var2);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (*(long **)(&this->field_0x170 + (long)p_Var2) == (long *)0x0) {
          if (*(void **)(&this->field_0x150 + (long)p_Var2) != (void *)0x0) {
            free(*(void **)(&this->field_0x150 + (long)p_Var2));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x170 + (long)p_Var2) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x190 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x15c + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x164 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x150 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x180 + (long)p_Var2) = 0;
    *(undefined4 *)(&this->field_0x188 + (long)p_Var2) = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86_avx512::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else if (elempack == 1 && out_elempack == 1)
    {
        weight_data_tm = weight_data;
    }
    else
    {
        deformableconv2d_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}